

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pline.c
# Opt level: O2

void You_hear(char *line,...)

{
  int iVar1;
  char in_AL;
  size_t sVar2;
  char *__dest;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list the_args;
  __va_list_tag local_e8;
  undefined1 local_c8 [8];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  iVar1 = u.usleep;
  local_e8.reg_save_area = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Da;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_e8.overflow_arg_area = &the_args[0].overflow_arg_area;
  local_e8.gp_offset = 8;
  local_e8.fp_offset = 0x30;
  local_c0 = in_RSI;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  if ((u._1052_1_ & 2) == 0) {
    sVar2 = strlen(line);
    if (iVar1 == 0) {
      __dest = You_buf((int)sVar2 + 10);
      builtin_strncpy(__dest,"You hear ",10);
    }
    else {
      __dest = You_buf((int)sVar2 + 0x19);
      builtin_strncpy(__dest,"You dream that you hear ",0x19);
    }
  }
  else {
    sVar2 = strlen(line);
    __dest = You_buf((int)sVar2 + 0x11);
    builtin_strncpy(__dest,"You barely hear ",0x11);
  }
  strcat(__dest,line);
  vpline(__dest,&local_e8);
  return;
}

Assistant:

void You_hear (const char *line, ...)
{
	va_list the_args;
	char *tmp;
	va_start(the_args, line);
	if (Underwater)
		YouPrefix(tmp, "You barely hear ", line);
	else if (u.usleep)
		YouPrefix(tmp, "You dream that you hear ", line);
	else
		YouPrefix(tmp, "You hear ", line);
	vpline(strcat(tmp, line), the_args);
	va_end(the_args);
}